

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::protos::pbzero::TrackEvent::set_track_uuid(TrackEvent *this,uint64_t value)

{
  uint64_t value_local;
  TrackEvent *this_local;
  
  protozero::internal::FieldWriter<(protozero::proto_utils::ProtoSchemaType)4>::Append
            (&this->super_Message,0xb,value);
  return;
}

Assistant:

void set_track_uuid(uint64_t value) {
    static constexpr uint32_t field_id = FieldMetadata_TrackUuid::kFieldId;
    // Call the appropriate protozero::Message::Append(field_id, ...)
    // method based on the type of the field.
    ::protozero::internal::FieldWriter<
      ::protozero::proto_utils::ProtoSchemaType::kUint64>
        ::Append(*this, field_id, value);
  }